

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_irreg_distr64(int g_a,int64_t *map,int64_t *block)

{
  Integer IVar1;
  Integer *__ptr;
  long in_RDX;
  int in_EDI;
  int i;
  Integer *_ga_map_capi;
  Integer _ga_work [7];
  Integer ndim;
  Integer aa;
  int local_74;
  undefined8 local_68 [3];
  int64_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int64_t *in_stack_ffffffffffffffc0;
  
  IVar1 = pnga_get_dimension((long)in_EDI);
  for (local_74 = 0; local_74 < IVar1; local_74 = local_74 + 1) {
    local_68[(IVar1 - local_74) + -1] = *(undefined8 *)(in_RDX + (long)local_74 * 8);
  }
  __ptr = copy_map64(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  pnga_set_irreg_distr
            ((Integer)in_stack_ffffffffffffffc0,
             (Integer *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0);
  free(__ptr);
  return;
}

Assistant:

void NGA_Set_irreg_distr64(int g_a, int64_t map[], int64_t block[])
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map64(block, (int)ndim, map);

    wnga_set_irreg_distr(aa, _ga_map_capi, _ga_work);
    free(_ga_map_capi);
}